

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_globals.cpp
# Opt level: O2

void __thiscall
megumax::SearchGlobals::SearchGlobals
          (SearchGlobals *this,uint64_t nodes,
          optional<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> start_time,
          optional<libchess::UCIGoParameters> *go_parameters)

{
  *(undefined8 *)((long)&(this->debug_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->debug_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->debug_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->debug_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->debug_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->debug_cv);
  (this->side_to_move_).super_MetaValueType<int>.value_ = 0;
  this->searching_ = (__atomic_base<bool>)0x0;
  this->stop_flag_ = (__atomic_base<bool>)0x0;
  (this->nodes_).super___atomic_base<unsigned_long>._M_i = nodes;
  (this->start_time_).
  super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_true,_true>._M_payload.
  super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>._M_payload =
       start_time.
       super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_true,_true>.
       _M_payload.super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
       ._M_payload;
  (this->start_time_).
  super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_true,_true>._M_payload.
  super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>._M_engaged =
       start_time.
       super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_true,_true>.
       _M_payload.super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
       ._M_engaged;
  std::_Optional_base<libchess::UCIGoParameters,_false,_false>::_Optional_base
            (&(this->go_parameters_).super__Optional_base<libchess::UCIGoParameters,_false,_false>,
             &go_parameters->super__Optional_base<libchess::UCIGoParameters,_false,_false>);
  this->debug_ = false;
  return;
}

Assistant:

SearchGlobals::SearchGlobals(std::uint64_t nodes,
                             std::optional<std::chrono::milliseconds> start_time,
                             std::optional<libchess::UCIGoParameters> go_parameters) noexcept
    : debug_mutex(),
      debug_cv(),
      side_to_move_(libchess::constants::WHITE),
      searching_(false),
      stop_flag_(false),
      nodes_(nodes),
      start_time_(start_time),
      go_parameters_(std::move(go_parameters)),
      debug_(false) {
}